

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread_test.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  pthread_t *__newthread;
  int *__arg;
  bool bVar5;
  void *dummy;
  pthread_mutexattr_t mutex_attr;
  pthread_t threads [10];
  pthread_attr_t attr;
  int pdata [10];
  
  _mpp_log_l(4,"mpp_thread_test","vpu test start\n",0);
  pthread_attr_init((pthread_attr_t *)&attr);
  pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
  __newthread = threads;
  __arg = pdata;
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    *__arg = (int)lVar4;
    pthread_create(__newthread,(pthread_attr_t *)&attr,thread_test,__arg);
    __newthread = __newthread + 1;
    __arg = __arg + 1;
  }
  sleep(2);
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    pthread_join(threads[lVar4],&dummy);
  }
  _mpp_debug = 1;
  uVar1 = mpp_time();
  iVar3 = 10000;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    mutex_performance_test_once();
  }
  uVar2 = mpp_time();
  mpp_time_diff(uVar1,uVar2,0);
  pthread_mutexattr_init((pthread_mutexattr_t *)&mutex_attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&mutex_attr,1);
  pthread_mutex_init((pthread_mutex_t *)&mutex_0,(pthread_mutexattr_t *)&mutex_attr);
  pthread_mutex_init((pthread_mutex_t *)&mutex_1,(pthread_mutexattr_t *)&mutex_attr);
  pthread_cond_init((pthread_cond_t *)&cond_0,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&cond_1,(pthread_condattr_t *)0x0);
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&mutex_attr);
  uVar1 = mpp_time();
  pthread_create(threads,(pthread_attr_t *)&attr,mutex_performance_test_loop_0,(void *)0x0);
  flag_0 = 0;
  pthread_create(threads + 1,(pthread_attr_t *)&attr,mutex_performance_test_loop_1,(void *)0x0);
  pthread_join(threads[0],&dummy);
  pthread_join(threads[1],&dummy);
  uVar2 = mpp_time();
  mpp_time_diff(uVar1,uVar2,0,"lock and signal test");
  pthread_cond_destroy((pthread_cond_t *)&cond_0);
  pthread_cond_destroy((pthread_cond_t *)&cond_1);
  pthread_attr_destroy((pthread_attr_t *)&attr);
  _mpp_debug = 0;
  _mpp_log_l(4,"mpp_thread_test","vpu test end\n",0);
  return 0;
}

Assistant:

int main()
{
    int i;
    int pdata[MAX_THREAD_NUM];
    pthread_t threads[MAX_THREAD_NUM];
    pthread_attr_t attr;
    pthread_mutexattr_t mutex_attr;
    void *dummy;
    RK_S64 time_start, time_end;

    mpp_log("vpu test start\n");
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    for (i = 0; i < MAX_THREAD_NUM; i++) {
        pdata[i] = i;
        pthread_create(&threads[i], &attr, thread_test, &pdata[i]);
    }

    sleep(2);

    for (i = 0; i < MAX_THREAD_NUM; i++) {
        pthread_join(threads[i], &dummy);
    }

    mpp_debug = MPP_DBG_TIMING;
    time_start = mpp_time();

    for (i = 0; i < MAX_LOCK_LOOP; i++)
        mutex_performance_test_once();

    time_end = mpp_time();
    mpp_time_diff(time_start, time_end, 0, "lock unlock test");

    pthread_mutexattr_init(&mutex_attr);
    pthread_mutexattr_settype(&mutex_attr, PTHREAD_MUTEX_RECURSIVE);

    pthread_mutex_init(&mutex_0, &mutex_attr);
    pthread_mutex_init(&mutex_1, &mutex_attr);
    pthread_cond_init(&cond_0, NULL);
    pthread_cond_init(&cond_1, NULL);
    pthread_mutexattr_destroy(&mutex_attr);

    time_start = mpp_time();
    pthread_create(&threads[0], &attr, mutex_performance_test_loop_0, NULL);
    flag_0 = 0;
    pthread_create(&threads[1], &attr, mutex_performance_test_loop_1, NULL);

    pthread_join(threads[0], &dummy);
    pthread_join(threads[1], &dummy);
    time_end = mpp_time();
    mpp_time_diff(time_start, time_end, 0, "lock and signal test");

    pthread_cond_destroy(&cond_0);
    pthread_cond_destroy(&cond_1);

    pthread_attr_destroy(&attr);

    mpp_debug = 0;
    mpp_log("vpu test end\n");
    return 0;
}